

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

xmlParserErrors xmlFdOpen(char *filename,int write,int *out)

{
  char *pcVar1;
  int iVar2;
  xmlParserErrors xVar3;
  int *piVar4;
  char *fromUri;
  char *local_28;
  
  local_28 = (char *)0x0;
  *out = -1;
  iVar2 = xmlConvertUriToPath(filename,&local_28);
  pcVar1 = local_28;
  if (iVar2 < 0) {
    xVar3 = XML_ERR_NO_MEMORY;
  }
  else {
    if (local_28 != (char *)0x0) {
      filename = local_28;
    }
    iVar2 = 0x241;
    if (write == 0) {
      iVar2 = 0;
    }
    xVar3 = XML_ERR_OK;
    iVar2 = open64(filename,iVar2,0x1b6);
    if (iVar2 < 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      xVar3 = XML_IO_ENOENT;
      if ((iVar2 != 2) && (iVar2 != 0x16)) {
        xVar3 = xmlIOErr(iVar2);
      }
    }
    else {
      *out = iVar2;
    }
    (*xmlFree)(pcVar1);
  }
  return xVar3;
}

Assistant:

static xmlParserErrors
xmlFdOpen(const char *filename, int write, int *out) {
    char *fromUri = NULL;
    int flags;
    int fd;
    xmlParserErrors ret;

    *out = -1;
    if (filename == NULL)
        return(XML_ERR_ARGUMENT);

    if (xmlConvertUriToPath(filename, &fromUri) < 0)
        return(XML_ERR_NO_MEMORY);

    if (fromUri != NULL)
        filename = fromUri;

#if defined(_WIN32)
    {
        wchar_t *wpath;

        wpath = __xmlIOWin32UTF8ToWChar(filename);
        if (wpath == NULL) {
            xmlFree(fromUri);
            return(XML_ERR_NO_MEMORY);
        }
        if (write)
            flags = _O_WRONLY | _O_CREAT | _O_TRUNC;
        else
            flags = _O_RDONLY;
	fd = _wopen(wpath, flags | _O_BINARY, 0666);
        xmlFree(wpath);
    }
#else
    if (write)
        flags = O_WRONLY | O_CREAT | O_TRUNC;
    else
        flags = O_RDONLY;
    fd = open(filename, flags, 0666);
#endif /* WIN32 */

    if (fd < 0) {
        /*
         * Windows and possibly other platforms return EINVAL
         * for invalid filenames.
         */
        if ((errno == ENOENT) || (errno == EINVAL)) {
            ret = XML_IO_ENOENT;
        } else {
            ret = xmlIOErr(errno);
        }
    } else {
        *out = fd;
        ret = XML_ERR_OK;
    }

    xmlFree(fromUri);
    return(ret);
}